

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::enforceBoundaryConstraints(Instance *this)

{
  bool bVar1;
  uint uVar2;
  long in_RDI;
  size_t vertex;
  int in_stack_ffffffffffffffac;
  Graph *in_stack_ffffffffffffffb0;
  expr *e;
  optimize *this_00;
  int in_stack_ffffffffffffffd4;
  ast_vector_tpl<z3::expr> *in_stack_ffffffffffffffd8;
  expr local_20;
  optimize *local_10;
  
  local_10 = (optimize *)0x0;
  while (this_00 = local_10,
        uVar2 = z3::ast_vector_tpl<z3::expr>::size
                          ((ast_vector_tpl<z3::expr> *)in_stack_ffffffffffffffb0),
        this_00 < (optimize *)(ulong)uVar2) {
    bVar1 = Graph::isBoundary(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (bVar1) {
      in_stack_ffffffffffffffb0 = (Graph *)(in_RDI + 0x148);
      e = &local_20;
      z3::ast_vector_tpl<z3::expr>::operator[](in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      z3::optimize::add(this_00,e);
      z3::expr::~expr((expr *)0x10739c);
    }
    local_10 = (optimize *)((long)&(local_10->super_object).m_ctx + 1);
  }
  return;
}

Assistant:

void Instance::enforceBoundaryConstraints() {
  for (size_t vertex = 0; vertex < borderVars.size(); vertex++) {
    if (graph.isBoundary(vertex)) {
      solver.add(borderVars[vertex]);
    }
  }
}